

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SimpleBinsSelectExprSyntax::setChild
          (SimpleBinsSelectExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  MatchesClauseSyntax *pMVar2;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (index == 0) {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar1;
  }
  else {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pMVar2 = (MatchesClauseSyntax *)0x0;
    }
    else {
      pMVar2 = (MatchesClauseSyntax *)TokenOrSyntax::node(&child);
    }
    this->matchesClause = pMVar2;
  }
  return;
}

Assistant:

void SimpleBinsSelectExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: matchesClause = child.node() ? &child.node()->as<MatchesClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}